

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ugrid2mesh.c
# Opt level: O1

lint swapi8(lint d)

{
  return (ulong)d >> 0x38 | (d & 0xff000000000000U) >> 0x28 | (d & 0xff0000000000U) >> 0x18 |
         (d & 0xff00000000U) >> 8 | (d & 0xff000000U) << 8 | (d & 0xff0000U) << 0x18 |
         (d & 0xff00U) << 0x28 | d << 0x38;
}

Assistant:

lint swapi8(lint d)
{
   lint a;
   unsigned char *dst = (unsigned char *)&a;
   unsigned char *src = (unsigned char *)&d;
   
   if ( ! littleEndian() ) return d;

   dst[0] = src[7];
   dst[1] = src[6];
   dst[2] = src[5];
   dst[3] = src[4];
   dst[4] = src[3];
   dst[5] = src[2];
   dst[6] = src[1];
   dst[7] = src[0];
  
   return a;
}